

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O3

int zip_resolve_symlink(PHYSFS_Io *io,ZIPinfo *info,ZIPentry *entry)

{
  size_t _len;
  ulong len;
  ZIPinfo *info_00;
  mz_free_func p_Var1;
  void *pvVar2;
  PHYSFS_Io *pPVar3;
  uchar uVar4;
  int iVar5;
  uint uVar6;
  uchar *__s;
  uchar *puVar7;
  mz_internal_state *pmVar8;
  uchar *puVar9;
  size_t sVar10;
  uchar *puVar11;
  ZIPentry *entry_00;
  undefined1 *puVar12;
  mz_stream *pmVar13;
  uchar *puVar14;
  mz_stream local_b8;
  ZIPinfo *local_48;
  uchar *local_40;
  PHYSFS_Io *local_38;
  
  pmVar13 = &local_b8;
  _len = entry->uncompressed_size;
  iVar5 = (*io->seek)(io,entry->offset);
  if (iVar5 == 0) {
    return 0;
  }
  if (_len + 1 < 0x100) {
    pmVar13 = (mz_stream *)((long)&local_b8 - (_len + 0x18 & 0xfffffffffffffff0));
    puVar12 = (undefined1 *)pmVar13;
  }
  else {
    puVar12 = (undefined1 *)0x0;
  }
  local_38 = io;
  *(undefined8 *)((long)pmVar13 + -8) = 0x116700;
  __s = (uchar *)__PHYSFS_initSmallAlloc(puVar12,_len + 1);
  pPVar3 = local_38;
  if (__s == (uchar *)0x0) {
    *(undefined8 *)((long)pmVar13 + -8) = 0x116740;
    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
    return 0;
  }
  local_48 = info;
  if (entry->compression_method == 0) {
    *(undefined8 *)((long)pmVar13 + -8) = 0x116756;
    uVar6 = __PHYSFS_readAll(pPVar3,__s,_len);
  }
  else {
    len = entry->compressed_size;
    uVar6 = 0;
    if (len < 0x100) {
      pmVar13 = (mz_stream *)((long)pmVar13 + -(len + 0x17 & 0xfffffffffffffff0));
      puVar12 = (undefined1 *)pmVar13;
    }
    else {
      puVar12 = (undefined1 *)0x0;
    }
    *(undefined8 *)((long)pmVar13 + -8) = 0x116768;
    puVar7 = (uchar *)__PHYSFS_initSmallAlloc(puVar12,len);
    pPVar3 = local_38;
    if (puVar7 != (uchar *)0x0) {
      local_40 = puVar7;
      *(undefined8 *)((long)pmVar13 + -8) = 0x116784;
      iVar5 = __PHYSFS_readAll(pPVar3,puVar7,len);
      uVar6 = 0;
      if (iVar5 != 0) {
        local_b8.state = (mz_internal_state *)0x0;
        local_b8.total_in = 0;
        local_b8.data_type = 0;
        local_b8._92_4_ = 0;
        local_b8.zalloc = zlibPhysfsAlloc;
        local_b8.zfree = zlibPhysfsFree;
        local_b8.opaque = &__PHYSFS_AllocatorHooks;
        local_b8.next_in = local_40;
        local_b8._8_8_ = len & 0xffffffff;
        local_b8._32_8_ = _len & 0xffffffff;
        local_b8.total_out = 0;
        local_b8.msg = (char *)0x0;
        local_b8.adler = 0;
        local_b8.reserved = 0;
        local_b8.next_out = __s;
        *(undefined8 *)((long)pmVar13 + -8) = 0x116807;
        pmVar8 = (mz_internal_state *)(*__PHYSFS_AllocatorHooks.Malloc)(0xab10);
        if (pmVar8 == (mz_internal_state *)0x0) {
          *(undefined8 *)((long)pmVar13 + -8) = 0x11688c;
          PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
        }
        else {
          *(undefined4 *)pmVar8 = 0;
          *(undefined4 *)(pmVar8 + 0xab0c) = 1;
          *(undefined8 *)(pmVar8 + 11000) = 0;
          *(undefined8 *)(pmVar8 + 0x2b00) = 1;
          *(undefined4 *)(pmVar8 + 0x2b08) = 0xfffffff1;
          local_b8.state = pmVar8;
          *(undefined8 *)((long)pmVar13 + -8) = 0x116846;
          PHYSFS_setErrorCode(PHYSFS_ERR_OK);
          *(undefined8 *)((long)pmVar13 + -8) = 0x116853;
          uVar6 = mz_inflate(&local_b8,4);
          *(undefined8 *)((long)pmVar13 + -8) = 0x11685d;
          zlib_err(uVar6);
          pvVar2 = local_b8.opaque;
          p_Var1 = local_b8.zfree;
          pmVar8 = local_b8.state;
          if (local_b8.state != (mz_internal_state *)0x0) {
            *(undefined8 *)((long)pmVar13 + -8) = 0x11686d;
            (*p_Var1)(pvVar2,pmVar8);
            local_b8.state = (mz_internal_state *)0x0;
          }
          uVar6 = (uint)(uVar6 < 2);
        }
      }
      puVar7 = local_40;
      *(undefined8 *)((long)pmVar13 + -8) = 0x116895;
      __PHYSFS_smallFree(puVar7);
    }
  }
  if (uVar6 == 0) goto LAB_001169df;
  __s[entry->uncompressed_size] = '\0';
  puVar7 = __s;
  if (entry->version < 0x100) {
    do {
      if (*puVar7 == '\\') {
        *puVar7 = '/';
      }
      else if (*puVar7 == '\0') break;
      puVar7 = puVar7 + 1;
    } while( true );
  }
  *(undefined8 *)((long)pmVar13 + -8) = 0x1168d5;
  puVar9 = (uchar *)strchr((char *)__s,0x2f);
  puVar7 = __s;
  info_00 = local_48;
  while (local_48 = info_00, puVar9 != (uchar *)0x0) {
    if (puVar9[1] == '.') {
      uVar4 = puVar9[2];
      puVar14 = puVar9;
      if (uVar4 == '\0') {
        *puVar9 = '\0';
      }
      else if (uVar4 == '.') {
        uVar4 = puVar9[3];
        if (uVar4 == '/') {
          *(undefined8 *)((long)pmVar13 + -8) = 0x116935;
          sVar10 = strlen((char *)(puVar9 + 4));
          *(undefined8 *)((long)pmVar13 + -8) = 0x116944;
          memmove(puVar7,puVar9 + 4,sVar10 + 1);
          puVar9 = puVar7;
          do {
            puVar11 = puVar9;
            puVar14 = __s;
            if (puVar11 == __s) break;
            puVar9 = puVar11 + -1;
            puVar14 = puVar11;
          } while (puVar11[-1] != '/');
          uVar4 = puVar7[3];
          puVar9 = puVar7;
          puVar7 = puVar14;
        }
        puVar14 = puVar9;
        if (uVar4 == '\0') {
          *puVar7 = '\0';
        }
      }
      else if (uVar4 == '/') {
        *(undefined8 *)((long)pmVar13 + -8) = 0x11690a;
        sVar10 = strlen((char *)(puVar9 + 2));
        *(undefined8 *)((long)pmVar13 + -8) = 0x116919;
        memmove(puVar9,puVar9 + 2,sVar10 + 1);
      }
    }
    else {
      puVar14 = puVar9 + 1;
      puVar7 = puVar9;
    }
    *(undefined8 *)((long)pmVar13 + -8) = 0x116976;
    puVar9 = (uchar *)strchr((char *)puVar14,0x2f);
    info_00 = local_48;
  }
  *(undefined8 *)((long)pmVar13 + -8) = 0x1169b0;
  entry_00 = (ZIPentry *)__PHYSFS_DirTreeFind(&info_00->tree,(char *)__s);
  pPVar3 = local_38;
  if (entry_00 == (ZIPentry *)0x0) {
LAB_001169d8:
    entry_00 = (ZIPentry *)0x0;
  }
  else {
    *(undefined8 *)((long)pmVar13 + -8) = 0x1169c7;
    iVar5 = zip_resolve(pPVar3,info_00,entry_00);
    if (iVar5 == 0) goto LAB_001169d8;
    if (entry_00->symlink != (ZIPentry *)0x0) {
      entry_00 = entry_00->symlink;
    }
  }
  entry->symlink = entry_00;
LAB_001169df:
  *(undefined8 *)((long)pmVar13 + -8) = 0x1169e7;
  __PHYSFS_smallFree(__s);
  return (uint)(entry->symlink != (_ZIPentry *)0x0);
}

Assistant:

static int zip_resolve_symlink(PHYSFS_Io *io, ZIPinfo *info, ZIPentry *entry)
{
    const size_t size = (size_t) entry->uncompressed_size;
    char *path = NULL;
    int rc = 0;

    /*
     * We've already parsed the local file header of the symlink at this
     *  point. Now we need to read the actual link from the file data and
     *  follow it.
     */

    BAIL_IF_ERRPASS(!io->seek(io, entry->offset), 0);

    path = (char *) __PHYSFS_smallAlloc(size + 1);
    BAIL_IF(!path, PHYSFS_ERR_OUT_OF_MEMORY, 0);
    
    if (entry->compression_method == COMPMETH_NONE)
        rc = __PHYSFS_readAll(io, path, size);

    else  /* symlink target path is compressed... */
    {
        z_stream stream;
        const size_t complen = (size_t) entry->compressed_size;
        PHYSFS_uint8 *compressed = (PHYSFS_uint8*) __PHYSFS_smallAlloc(complen);
        if (compressed != NULL)
        {
            if (__PHYSFS_readAll(io, compressed, complen))
            {
                initializeZStream(&stream);
                stream.next_in = compressed;
                stream.avail_in = (unsigned int) complen;
                stream.next_out = (unsigned char *) path;
                stream.avail_out = (unsigned int) size;
                if (zlib_err(inflateInit2(&stream, -MAX_WBITS)) == Z_OK)
                {
                    rc = zlib_err(inflate(&stream, Z_FINISH));
                    inflateEnd(&stream);

                    /* both are acceptable outcomes... */
                    rc = ((rc == Z_OK) || (rc == Z_STREAM_END));
                } /* if */
            } /* if */
            __PHYSFS_smallFree(compressed);
        } /* if */
    } /* else */

    if (rc)
    {
        path[entry->uncompressed_size] = '\0';    /* null-terminate it. */
        zip_convert_dos_path(entry->version, path);
        entry->symlink = zip_follow_symlink(io, info, path);
    } /* else */

    __PHYSFS_smallFree(path);

    return (entry->symlink != NULL);
}